

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_parserInternals(void)

{
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  xmlParserCtxtPtr pxVar13;
  undefined8 uVar14;
  xmlNodePtr pxVar15;
  size_t sVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 uVar21;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined8 uVar22;
  int test_ret_16;
  undefined8 *puVar23;
  uint *puVar24;
  int n_ctxt;
  uint uVar25;
  xmlNodePtr in_RSI;
  undefined8 uVar26;
  int *piVar27;
  undefined *puVar28;
  int n_val;
  int *piVar29;
  int test_ret;
  int iVar30;
  uint uVar31;
  undefined4 uVar32;
  xmlChar *pxVar33;
  undefined **ppuVar34;
  char *pcVar35;
  int test_ret_4;
  uint uVar36;
  undefined4 *puVar37;
  int *piVar38;
  int n_value;
  uint uVar39;
  int test_ret_2;
  int test_ret_1;
  int test_ret_7;
  int test_ret_3;
  int test_ret_19;
  int test_ret_20;
  int test_ret_21;
  int test_ret_22;
  uint local_84;
  int local_80;
  int local_74;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  
  if (quiet == '\0') {
    puts("Testing parserInternals : 30 of 87 functions ...");
  }
  uVar25 = 0;
  iVar30 = 0;
  do {
    iVar4 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar25,(int)in_RSI);
    uVar14 = inputPop(pxVar13);
    xmlFreeInputStream(uVar14);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in inputPop",(ulong)(uint)(iVar5 - iVar4));
      iVar30 = iVar30 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar25;
      printf(" %d");
      putchar(10);
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar5 = 0;
  iVar4 = 0;
  do {
    iVar7 = (int)in_RSI;
    iVar6 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(iVar4,iVar7);
    in_RSI = (xmlNodePtr)0x0;
    inputPush(pxVar13);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in inputPush",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 3);
  function_tests = function_tests + 1;
  uVar25 = 0;
  iVar4 = 0;
  do {
    iVar6 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar25,(int)in_RSI);
    namePop(pxVar13);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in namePop",(ulong)(uint)(iVar7 - iVar6));
      iVar4 = iVar4 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar25;
      printf(" %d");
      putchar(10);
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  local_84 = 0;
  uVar25 = 0;
  do {
    puVar23 = &DAT_00162d68;
    pxVar15 = (xmlNodePtr)0x0;
    do {
      iVar7 = (int)in_RSI;
      iVar6 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar25,iVar7);
      uVar39 = (uint)pxVar15;
      if (uVar39 < 4) {
        in_RSI = (xmlNodePtr)*puVar23;
      }
      else {
        in_RSI = (xmlNodePtr)0x0;
      }
      namePush(pxVar13);
      call_tests = call_tests + 1;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in namePush",(ulong)(uint)(iVar7 - iVar6));
        local_84 = local_84 + 1;
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar15;
      }
      uVar39 = uVar39 + 1;
      pxVar15 = (xmlNodePtr)(ulong)uVar39;
      puVar23 = puVar23 + 1;
    } while (uVar39 != 5);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  uVar25 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar25,(int)in_RSI);
    pxVar15 = (xmlNodePtr)nodePop(pxVar13);
    desret_xmlNodePtr(pxVar15);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in nodePop",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar25;
      printf(" %d");
      putchar(10);
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar25 = 0;
  do {
    uVar39 = 0;
    do {
      iVar8 = (int)in_RSI;
      iVar9 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar25,iVar8);
      in_RSI = gen_xmlNodePtr(uVar39,iVar8);
      nodePush(pxVar13,in_RSI);
      call_tests = call_tests + 1;
      iVar8 = extraout_EDX;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
        iVar8 = extraout_EDX_00;
      }
      des_xmlNodePtr(uVar39,in_RSI,iVar8);
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar9 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in nodePush",(ulong)(uint)(iVar8 - iVar9));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar25);
        in_RSI = (xmlNodePtr)(ulong)uVar39;
        printf(" %d");
        putchar(10);
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 != 3);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  iVar30 = iVar5 + iVar30 + iVar4 + local_84;
  function_tests = function_tests + 1;
  puVar23 = &DAT_00162d68;
  uVar25 = 0;
  iVar4 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar25 < 4) {
      uVar14 = *puVar23;
    }
    else {
      uVar14 = 0;
    }
    xmlCheckLanguageID(uVar14);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar5 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCheckLanguageID",(ulong)(uint)(iVar8 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d",(ulong)uVar25);
      putchar(10);
    }
    uVar25 = uVar25 + 1;
    puVar23 = puVar23 + 1;
  } while (uVar25 != 5);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar25 = 0;
  do {
    local_84 = 0;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      uVar19 = 0;
      pxVar33 = (xmlChar *)0x0;
      if (bVar2) {
        pxVar33 = chartab;
      }
      puVar37 = &DAT_0015fd14;
      do {
        iVar8 = xmlMemBlocks();
        uVar32 = 0xffffffff;
        if (uVar25 < 4) {
          uVar32 = (&DAT_0015fd14)[uVar25];
        }
        xmlCopyChar(uVar32,pxVar33,*puVar37);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar9 = xmlMemBlocks();
        if (iVar8 != iVar9) {
          iVar9 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCopyChar",(ulong)(uint)(iVar9 - iVar8));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar25);
          printf(" %d",(ulong)local_84);
          printf(" %d",uVar19);
          putchar(10);
        }
        uVar39 = (int)uVar19 + 1;
        uVar19 = (ulong)uVar39;
        puVar37 = puVar37 + 1;
      } while (uVar39 != 4);
      local_84 = 1;
      bVar1 = false;
    } while (bVar2);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 4);
  function_tests = function_tests + 1;
  local_84 = 0;
  uVar25 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    pxVar33 = (xmlChar *)0x0;
    if (bVar2) {
      pxVar33 = chartab;
    }
    puVar37 = &DAT_0015fd14;
    uVar19 = 0;
    do {
      iVar8 = xmlMemBlocks();
      xmlCopyCharMultiByte(pxVar33,*puVar37);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyCharMultiByte",(ulong)(uint)(iVar9 - iVar8));
        local_84 = local_84 + 1;
        printf(" %d",(ulong)uVar25);
        printf(" %d",uVar19);
        putchar(10);
      }
      uVar39 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar39;
      puVar37 = puVar37 + 1;
    } while (uVar39 != 4);
    uVar25 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  local_74 = 0;
  uVar25 = 0;
  do {
    uVar19 = 0;
    do {
      puVar23 = &DAT_00162d68;
      uVar39 = 0;
      do {
        iVar8 = xmlMemBlocks();
        if (uVar25 < 4) {
          uVar14 = (&DAT_00162d68)[uVar25];
        }
        else {
          uVar14 = 0;
        }
        if ((uint)uVar19 < 4) {
          uVar26 = (&DAT_00162d68)[uVar19];
        }
        else {
          uVar26 = 0;
        }
        if (uVar39 < 4) {
          uVar22 = *puVar23;
        }
        else {
          uVar22 = 0;
        }
        xmlCreateEntityParserCtxt(uVar14,uVar26,uVar22);
        xmlFreeParserCtxt();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar9 = xmlMemBlocks();
        if (iVar8 != iVar9) {
          iVar9 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCreateEntityParserCtxt",(ulong)(uint)(iVar9 - iVar8)
                );
          local_74 = local_74 + 1;
          printf(" %d",(ulong)uVar25);
          printf(" %d",uVar19);
          printf(" %d");
          putchar(10);
        }
        uVar39 = uVar39 + 1;
        puVar23 = puVar23 + 1;
      } while (uVar39 != 5);
      uVar39 = (uint)uVar19 + 1;
      uVar19 = (ulong)uVar39;
    } while (uVar39 != 5);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 5);
  function_tests = function_tests + 1;
  ppuVar34 = &PTR_anon_var_dwarf_62c_00162d28;
  uVar25 = 0;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    if (uVar25 < 5) {
      puVar28 = *ppuVar34;
    }
    else {
      puVar28 = (undefined *)0x0;
    }
    xmlCreateFileParserCtxt(puVar28);
    xmlFreeParserCtxt();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCreateFileParserCtxt",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      printf(" %d",(ulong)uVar25);
      putchar(10);
    }
    uVar25 = uVar25 + 1;
    ppuVar34 = ppuVar34 + 1;
  } while (uVar25 != 6);
  function_tests = function_tests + 1;
  iVar30 = iVar7 + iVar4 + iVar30 + iVar6 + iVar5 + local_84;
  local_84 = 0;
  uVar25 = 0;
  do {
    piVar38 = &DAT_0015fd14;
    uVar19 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar25 == 0) {
        bVar1 = false;
        pcVar35 = "foo";
      }
      else if (uVar25 == 2) {
        bVar1 = false;
        pcVar35 = "test/ent2";
      }
      else if (uVar25 == 1) {
        bVar1 = false;
        pcVar35 = "<foo/>";
      }
      else {
        bVar1 = true;
        pcVar35 = (char *)0x0;
      }
      iVar5 = *piVar38;
      if ((bVar1) || (sVar16 = strlen(pcVar35), iVar5 <= (int)sVar16 + 1)) {
        uVar14 = xmlCreateMemoryParserCtxt(pcVar35,iVar5);
        xmlFreeParserCtxt(uVar14);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCreateMemoryParserCtxt",(ulong)(uint)(iVar5 - iVar4)
                );
          local_84 = local_84 + 1;
          printf(" %d",(ulong)uVar25);
          printf(" %d",uVar19);
          putchar(10);
        }
      }
      uVar39 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar39;
      piVar38 = piVar38 + 1;
    } while (uVar39 != 4);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 4);
  function_tests = function_tests + 1;
  iVar30 = local_74 + iVar8 + iVar30 + local_84;
  local_84 = 0;
  uVar25 = 0;
  do {
    puVar24 = &DAT_0015fd14;
    uVar39 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar25 < 5) {
        puVar28 = (&PTR_anon_var_dwarf_62c_00162d28)[uVar25];
      }
      else {
        puVar28 = (undefined *)0x0;
      }
      piVar38 = (int *)(ulong)*puVar24;
      xmlCreateURLParserCtxt(puVar28);
      xmlFreeParserCtxt();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCreateURLParserCtxt",(ulong)(uint)(iVar5 - iVar4));
        local_84 = local_84 + 1;
        printf(" %d",(ulong)uVar25);
        piVar38 = (int *)(ulong)uVar39;
        printf(" %d");
        putchar(10);
      }
      uVar39 = uVar39 + 1;
      puVar24 = puVar24 + 1;
    } while (uVar39 != 4);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 6);
  function_tests = function_tests + 1;
  local_80 = 0;
  uVar25 = 0;
  do {
    uVar39 = 0;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      iVar5 = (int)piVar38;
      iVar4 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar25,iVar5);
      piVar38 = (int *)0x0;
      if (bVar2) {
        piVar38 = inttab + 1;
      }
      xmlCurrentChar(pxVar13);
      call_tests = call_tests + 1;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCurrentChar",(ulong)(uint)(iVar5 - iVar4));
        local_80 = local_80 + 1;
        printf(" %d",(ulong)uVar25);
        piVar38 = (int *)(ulong)uVar39;
        printf(" %d");
        putchar(10);
      }
      uVar39 = 1;
      bVar1 = false;
    } while (bVar2);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar30 = iVar30 + local_84 + local_80;
  puVar37 = &DAT_0015fd14;
  uVar25 = 0;
  local_80 = 0;
  do {
    iVar4 = xmlMemBlocks();
    xmlIsLetter(*puVar37);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsLetter",(ulong)(uint)(iVar5 - iVar4));
      local_80 = local_80 + 1;
      piVar38 = (int *)(ulong)uVar25;
      printf(" %d");
      putchar(10);
    }
    uVar25 = uVar25 + 1;
    puVar37 = puVar37 + 1;
  } while (uVar25 != 4);
  function_tests = function_tests + 1;
  iVar5 = 0;
  iVar4 = 0;
  do {
    iVar7 = (int)piVar38;
    iVar6 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(iVar4,iVar7);
    piVar38 = (int *)0x0;
    uVar14 = xmlNewEntityInputStream(pxVar13);
    xmlFreeInputStream(uVar14);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewEntityInputStream",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d");
      piVar38 = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 3);
  function_tests = function_tests + 1;
  local_84 = 0;
  uVar25 = 0;
  do {
    puVar23 = &DAT_00162d88;
    piVar29 = (int *)0x0;
    do {
      iVar6 = (int)piVar38;
      iVar4 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar25,iVar6);
      uVar39 = (uint)piVar29;
      if (uVar39 < 7) {
        piVar38 = (int *)*puVar23;
      }
      else {
        piVar38 = (int *)0x0;
      }
      uVar14 = xmlNewInputFromFile(pxVar13);
      xmlFreeInputStream(uVar14);
      call_tests = call_tests + 1;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar4 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewInputFromFile",(ulong)(uint)(iVar6 - iVar4));
        local_84 = local_84 + 1;
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        piVar38 = piVar29;
      }
      uVar39 = uVar39 + 1;
      piVar29 = (int *)(ulong)uVar39;
      puVar23 = puVar23 + 1;
    } while (uVar39 != 8);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  iVar30 = iVar30 + local_80;
  function_tests = function_tests + 1;
  uVar25 = 0;
  iVar4 = 0;
  do {
    iVar6 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar25,(int)piVar38);
    uVar14 = xmlNewInputStream(pxVar13);
    xmlFreeInputStream(uVar14);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewInputStream",(ulong)(uint)(iVar7 - iVar6));
      iVar4 = iVar4 + 1;
      piVar38 = (int *)(ulong)uVar25;
      printf(" %d");
      putchar(10);
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  local_80 = 0;
  uVar25 = 0;
  do {
    puVar23 = &DAT_00162d68;
    piVar29 = (int *)0x0;
    do {
      iVar7 = (int)piVar38;
      iVar6 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar25,iVar7);
      uVar39 = (uint)piVar29;
      if (uVar39 < 4) {
        piVar38 = (int *)*puVar23;
      }
      else {
        piVar38 = (int *)0x0;
      }
      uVar14 = xmlNewStringInputStream(pxVar13);
      xmlFreeInputStream(uVar14);
      call_tests = call_tests + 1;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewStringInputStream",(ulong)(uint)(iVar7 - iVar6));
        local_80 = local_80 + 1;
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
        piVar38 = piVar29;
      }
      uVar39 = uVar39 + 1;
      piVar29 = (int *)(ulong)uVar39;
      puVar23 = puVar23 + 1;
    } while (uVar39 != 5);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  iVar30 = iVar30 + iVar5 + local_84;
  function_tests = function_tests + 1;
  uVar25 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar25,(int)piVar38);
    xmlNextChar(pxVar13);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNextChar",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      piVar38 = (int *)(ulong)uVar25;
      printf(" %d");
      putchar(10);
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar5 = local_80 + iVar5;
  iVar6 = xmlMemBlocks();
  xmlParserInputShrink(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlParserInputShrink");
    piVar38 = (int *)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar25 = 0;
  local_84 = 0;
  do {
    iVar8 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar25,(int)piVar38);
    xmlPopInput(pxVar13);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPopInput",(ulong)(uint)(iVar9 - iVar8));
      local_84 = local_84 + 1;
      piVar38 = (int *)(ulong)uVar25;
      printf(" %d");
      putchar(10);
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  local_80 = 0;
  iVar8 = 0;
  do {
    iVar10 = (int)piVar38;
    iVar9 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(iVar8,iVar10);
    piVar38 = (int *)0x0;
    xmlPushInput(pxVar13);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPushInput",(ulong)(uint)(iVar10 - iVar9));
      local_80 = local_80 + 1;
      printf(" %d");
      piVar38 = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 3);
  function_tests = function_tests + 1;
  local_60 = 0;
  uVar25 = 0;
  do {
    puVar23 = &DAT_00162d68;
    uVar39 = 0;
    do {
      iVar9 = (int)piVar38;
      iVar8 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar25,iVar9);
      if (uVar39 < 4) {
        piVar38 = (int *)*puVar23;
      }
      else {
        piVar38 = (int *)0x0;
      }
      lVar17 = xmlSplitQName(pxVar13,piVar38,0);
      if (lVar17 != 0) {
        (*_xmlFree)(lVar17);
      }
      call_tests = call_tests + 1;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSplitQName",(ulong)(uint)(iVar9 - iVar8));
        local_60 = local_60 + 1;
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        piVar38 = (int *)0x0;
        printf(" %d");
        putchar(10);
      }
      uVar39 = uVar39 + 1;
      puVar23 = puVar23 + 1;
    } while (uVar39 != 5);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar30 = iVar30 + iVar4 + iVar5 + (uint)(iVar6 != iVar7) + local_84;
  local_5c = 0;
  local_84 = 0;
  do {
    uVar25 = 0;
    do {
      piVar29 = (int *)0x0;
      bVar1 = true;
      do {
        bVar2 = bVar1;
        iVar5 = (int)piVar38;
        iVar4 = xmlMemBlocks();
        pxVar13 = gen_xmlParserCtxtPtr(local_84,iVar5);
        if (uVar25 < 4) {
          piVar38 = (int *)(&DAT_00162d68)[uVar25];
        }
        else {
          piVar38 = (int *)0x0;
        }
        uVar14 = 0;
        if (bVar2) {
          uVar14 = 0x1658d8;
        }
        xmlStringCurrentChar(pxVar13,piVar38,uVar14);
        call_tests = call_tests + 1;
        if (pxVar13 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar13);
        }
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStringCurrentChar",(ulong)(uint)(iVar5 - iVar4));
          local_5c = local_5c + 1;
          printf(" %d",(ulong)local_84);
          printf(" %d",(ulong)uVar25);
          printf(" %d");
          putchar(10);
          piVar38 = piVar29;
        }
        piVar29 = (int *)0x1;
        bVar1 = false;
      } while (bVar2);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_84 = local_84 + 1;
  } while (local_84 != 3);
  function_tests = function_tests + 1;
  local_58 = 0;
  local_84 = 0;
  do {
    uVar25 = 0;
    do {
      uVar19 = 0;
      do {
        uVar20 = 0;
        do {
          uVar39 = 0xf82061 >> ((char)uVar20 * '\b' & 0x1fU);
          if (2 < (uint)uVar20) {
            uVar39 = 0;
          }
          uVar18 = 0;
          do {
            uVar21 = (char)(0xf82061 >> ((char)uVar18 * '\b' & 0x1fU));
            if (2 < (uint)uVar18) {
              uVar21 = 0;
            }
            piVar29 = (int *)0x0;
            do {
              iVar5 = (int)piVar38;
              iVar4 = xmlMemBlocks();
              pxVar13 = gen_xmlParserCtxtPtr(local_84,iVar5);
              if (uVar25 < 4) {
                piVar38 = (int *)(&DAT_00162d68)[uVar25];
              }
              else {
                piVar38 = (int *)0x0;
              }
              uVar32 = 0xffffffff;
              if ((uint)uVar19 < 4) {
                uVar32 = (&DAT_0015fd14)[uVar19];
              }
              uVar31 = (uint)piVar29;
              uVar3 = (undefined1)(0xf82061 >> ((char)piVar29 * '\b' & 0x1fU));
              if (2 < uVar31) {
                uVar3 = 0;
              }
              lVar17 = xmlStringDecodeEntities(pxVar13,piVar38,uVar32,uVar39 & 0xff,uVar21,uVar3);
              if (lVar17 != 0) {
                (*_xmlFree)(lVar17);
              }
              call_tests = call_tests + 1;
              if (pxVar13 != (xmlParserCtxtPtr)0x0) {
                xmlFreeParserCtxt(pxVar13);
              }
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              if (iVar4 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlStringDecodeEntities",
                       (ulong)(uint)(iVar5 - iVar4));
                local_58 = local_58 + 1;
                printf(" %d",(ulong)local_84);
                printf(" %d",(ulong)uVar25);
                printf(" %d",uVar19);
                printf(" %d",uVar20);
                printf(" %d",uVar18);
                printf(" %d");
                putchar(10);
                piVar38 = piVar29;
              }
              uVar31 = uVar31 + 1;
              piVar29 = (int *)(ulong)uVar31;
            } while (uVar31 != 4);
            uVar31 = (uint)uVar18 + 1;
            uVar18 = (ulong)uVar31;
          } while (uVar31 != 4);
          uVar39 = (uint)uVar20 + 1;
          uVar20 = (ulong)uVar39;
        } while (uVar39 != 4);
        uVar39 = (uint)uVar19 + 1;
        uVar19 = (ulong)uVar39;
      } while (uVar39 != 4);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_84 = local_84 + 1;
  } while (local_84 != 3);
  function_tests = function_tests + 1;
  local_54 = 0;
  uVar25 = 0;
  do {
    uVar39 = 0;
    do {
      uVar31 = 0;
      do {
        uVar12 = 0;
        do {
          piVar29 = (int *)(ulong)uVar12;
          uVar19 = 0;
          do {
            uVar21 = (undefined1)(0xf82061 >> ((char)uVar19 * '\b' & 0x1fU));
            if (2 < (uint)uVar19) {
              uVar21 = 0;
            }
            uVar20 = 0;
            do {
              uVar3 = (undefined1)(0xf82061 >> ((char)uVar20 * '\b' & 0x1fU));
              piVar27 = (int *)0x0;
              if (2 < (uint)uVar20) {
                uVar3 = 0;
              }
              do {
                iVar5 = (int)piVar38;
                iVar4 = xmlMemBlocks();
                pxVar13 = gen_xmlParserCtxtPtr(uVar25,iVar5);
                switch(uVar39) {
                case 0:
                  bVar1 = false;
                  pcVar35 = "foo";
                  break;
                case 1:
                  bVar1 = false;
                  pcVar35 = "<foo/>";
                  break;
                case 2:
                  bVar1 = false;
                  pcVar35 = anon_var_dwarf_1b5;
                  break;
                case 3:
                  bVar1 = false;
                  pcVar35 = " 2ab ";
                  break;
                default:
                  bVar1 = true;
                  pcVar35 = (char *)0x0;
                }
                uVar32 = 0xffffffff;
                iVar5 = -1;
                if (uVar31 < 4) {
                  iVar5 = (&DAT_0015fd14)[uVar31];
                }
                if (uVar12 < 4) {
                  uVar32 = (&DAT_0015fd14)[(long)piVar29];
                }
                uVar36 = (uint)piVar27;
                uVar11 = 0xf82061 >> ((char)piVar27 * '\b' & 0x1fU);
                if (2 < uVar36) {
                  uVar11 = 0;
                }
                if ((bVar1) ||
                   (piVar38 = piVar29, sVar16 = strlen(pcVar35), iVar5 <= (int)sVar16 + 1)) {
                  lVar17 = xmlStringLenDecodeEntities
                                     (pxVar13,pcVar35,iVar5,uVar32,uVar21,uVar3,uVar11 & 0xff);
                  if (lVar17 != 0) {
                    (*_xmlFree)(lVar17);
                  }
                  call_tests = call_tests + 1;
                  if (pxVar13 != (xmlParserCtxtPtr)0x0) {
                    xmlFreeParserCtxt(pxVar13);
                  }
                  xmlResetLastError();
                  iVar5 = xmlMemBlocks();
                  piVar38 = (int *)pcVar35;
                  if (iVar4 != iVar5) {
                    iVar5 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlStringLenDecodeEntities",
                           (ulong)(uint)(iVar5 - iVar4));
                    local_54 = local_54 + 1;
                    printf(" %d",(ulong)uVar25);
                    printf(" %d",(ulong)uVar39);
                    printf(" %d",(ulong)uVar31);
                    printf(" %d",piVar29);
                    printf(" %d",uVar19);
                    printf(" %d",uVar20);
                    printf(" %d");
                    putchar(10);
                    piVar38 = piVar27;
                  }
                }
                uVar36 = uVar36 + 1;
                piVar27 = (int *)(ulong)uVar36;
              } while (uVar36 != 4);
              uVar11 = (uint)uVar20 + 1;
              uVar20 = (ulong)uVar11;
            } while (uVar11 != 4);
            uVar11 = (uint)uVar19 + 1;
            uVar19 = (ulong)uVar11;
          } while (uVar11 != 4);
          uVar12 = uVar12 + 1;
        } while (uVar12 != 4);
        uVar31 = uVar31 + 1;
      } while (uVar31 != 4);
      uVar39 = uVar39 + 1;
    } while (uVar39 != 5);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  local_84 = 0;
  uVar25 = 0;
  do {
    puVar24 = &DAT_00152228;
    uVar39 = 0;
    do {
      iVar5 = (int)piVar38;
      iVar4 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar25,iVar5);
      piVar38 = (int *)0xffffffff;
      if (uVar39 < 3) {
        piVar38 = (int *)(ulong)*puVar24;
      }
      xmlSwitchEncoding(pxVar13);
      call_tests = call_tests + 1;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSwitchEncoding",(ulong)(uint)(iVar5 - iVar4));
        local_84 = local_84 + 1;
        printf(" %d",(ulong)uVar25);
        piVar38 = (int *)(ulong)uVar39;
        printf(" %d");
        putchar(10);
      }
      uVar39 = uVar39 + 1;
      puVar24 = puVar24 + 1;
    } while (uVar39 != 4);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  local_58 = iVar30 + local_80 + local_60 + local_5c + local_58;
  function_tests = function_tests + 1;
  iVar30 = 0;
  uVar25 = 0;
  do {
    iVar4 = local_58;
    iVar5 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar25,iVar4);
    xmlSwitchInputEncoding(pxVar13,0,0);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar5 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSwitchInputEncoding",(ulong)(uint)(iVar4 - iVar5));
      iVar30 = iVar30 + 1;
      printf(" %d",(ulong)uVar25);
      printf(" %d",0);
      printf(" %d",0);
      putchar(10);
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  local_58 = local_58 + local_54;
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar25 = 0;
  do {
    iVar5 = local_58;
    iVar6 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar25,iVar5);
    xmlSwitchToEncoding(pxVar13,0);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar6 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSwitchToEncoding",(ulong)(uint)(iVar5 - iVar6));
      iVar4 = iVar4 + 1;
      printf(" %d",(ulong)uVar25);
      printf(" %d",0);
      putchar(10);
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  function_tests = function_tests + 1;
  iVar4 = local_58 + local_84 + iVar30 + iVar4;
  if (iVar4 != 0) {
    printf("Module parserInternals: %d errors\n");
  }
  return iVar4;
}

Assistant:

static int
test_parserInternals(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing parserInternals : 30 of 87 functions ...\n");
    test_ret += test_inputPop();
    test_ret += test_inputPush();
    test_ret += test_namePop();
    test_ret += test_namePush();
    test_ret += test_nodePop();
    test_ret += test_nodePush();
    test_ret += test_xmlCheckLanguageID();
    test_ret += test_xmlCopyChar();
    test_ret += test_xmlCopyCharMultiByte();
    test_ret += test_xmlCreateEntityParserCtxt();
    test_ret += test_xmlCreateFileParserCtxt();
    test_ret += test_xmlCreateMemoryParserCtxt();
    test_ret += test_xmlCreateURLParserCtxt();
    test_ret += test_xmlCurrentChar();
    test_ret += test_xmlIsLetter();
    test_ret += test_xmlNewEntityInputStream();
    test_ret += test_xmlNewInputFromFile();
    test_ret += test_xmlNewInputStream();
    test_ret += test_xmlNewStringInputStream();
    test_ret += test_xmlNextChar();
    test_ret += test_xmlParserInputShrink();
    test_ret += test_xmlPopInput();
    test_ret += test_xmlPushInput();
    test_ret += test_xmlSetEntityReferenceFunc();
    test_ret += test_xmlSplitQName();
    test_ret += test_xmlStringCurrentChar();
    test_ret += test_xmlStringDecodeEntities();
    test_ret += test_xmlStringLenDecodeEntities();
    test_ret += test_xmlSwitchEncoding();
    test_ret += test_xmlSwitchInputEncoding();
    test_ret += test_xmlSwitchToEncoding();

    if (test_ret != 0)
	printf("Module parserInternals: %d errors\n", test_ret);
    return(test_ret);
}